

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O3

int16_t OPL3_EnvelopeCalcSin0(uint16_t phase,uint16_t envelope)

{
  uint uVar1;
  uint uVar2;
  undefined6 in_register_00000032;
  
  uVar1 = phase & 0xff ^ 0xff;
  if ((phase & 0x100) == 0) {
    uVar1 = phase & 0xff;
  }
  uVar2 = (uint)logsinrom[uVar1] + (int)CONCAT62(in_register_00000032,envelope) * 8;
  uVar1 = 0x1fff;
  if (uVar2 < 0x1fff) {
    uVar1 = uVar2;
  }
  return (ushort)((uint)exprom[uVar1 & 0xff] * 2 >> ((byte)(uVar1 >> 8) & 0x1f)) ^
         ((phase & 0x3ff) < 0x200) - 1;
}

Assistant:

static int16_t OPL3_EnvelopeCalcSin0(uint16_t phase, uint16_t envelope)
{
    uint16_t out = 0;
    uint16_t neg = 0;
    phase &= 0x3ff;
    if (phase & 0x200)
    {
        neg = 0xffff;
    }
    if (phase & 0x100)
    {
        out = logsinrom[(phase & 0xffu) ^ 0xffu];
    }
    else
    {
        out = logsinrom[phase & 0xffu];
    }
    return OPL3_EnvelopeCalcExp(out + (envelope << 3)) ^ neg;
}